

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O0

void __thiscall iutest::detail::iuRegex::iuRegex(iuRegex *this,char *pattern)

{
  char *pattern_local;
  iuRegex *this_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&this->m_re);
  std::__cxx11::string::string((string *)&this->m_pattern);
  Init(this,pattern);
  return;
}

Assistant:

iuRegex(const char* pattern) { Init(pattern); }